

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::SetImportLocationProperty
          (cmExportInstallFileGenerator *this,string *config,string *suffix,
          cmInstallTargetGenerator *itgen,ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations)

{
  cmGeneratorTarget *this_00;
  pointer pbVar1;
  bool bVar2;
  TargetType TVar3;
  mapped_type *pmVar4;
  string *obj;
  pointer b;
  string importValue;
  string prop;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string dest;
  
  if (itgen != (cmInstallTargetGenerator *)0x0) {
    bVar2 = cmInstallGenerator::InstallsForConfig(&itgen->super_cmInstallGenerator,config);
    if (bVar2) {
      this_00 = itgen->Target;
      cmInstallTargetGenerator::GetDestination(&dest,itgen,config);
      value._M_dataplus._M_p = (pointer)&value.field_2;
      value._M_string_length = 0;
      value.field_2._M_local_buf[0] = '\0';
      bVar2 = cmsys::SystemTools::FileIsFullPath(&dest);
      if (!bVar2) {
        std::__cxx11::string::assign((char *)&value);
      }
      std::__cxx11::string::append((string *)&value);
      std::__cxx11::string::append((char *)&value);
      if (itgen->ImportLibrary == true) {
        cmStrCat<char_const(&)[16],std::__cxx11::string_const&>
                  (&prop,(char (*) [16])0x6d4ddc,suffix);
        cmInstallTargetGenerator::GetInstallFilename(&importValue,this_00,config,NameImplibReal);
        std::__cxx11::string::append((string *)&value);
        std::__cxx11::string::~string((string *)&importValue);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&prop);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)importedLocations,&prop);
      }
      else {
        TVar3 = cmGeneratorTarget::GetType(itgen->Target);
        if (TVar3 == OBJECT_LIBRARY) {
          cmStrCat<char_const(&)[17],std::__cxx11::string_const&>
                    (&prop,(char (*) [17])"IMPORTED_OBJECTS",suffix);
          objects.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          objects.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          objects.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmInstallTargetGenerator::GetInstallObjectNames(itgen,config,&objects);
          pbVar1 = objects.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (b = objects.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; b != pbVar1; b = b + 1) {
            cmStrCat<std::__cxx11::string&,std::__cxx11::string&>(&importValue,&value,b);
            std::__cxx11::string::operator=((string *)b,(string *)&importValue);
            std::__cxx11::string::~string((string *)&importValue);
          }
          cmList::
          to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                    (&importValue,&objects);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&prop);
          std::__cxx11::string::operator=((string *)pmVar4,(string *)&importValue);
          std::__cxx11::string::~string((string *)&importValue);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)importedLocations,&prop);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&objects);
        }
        else {
          bVar2 = cmGeneratorTarget::IsFrameworkOnApple(this_00);
          if (bVar2) {
            bVar2 = cmGeneratorTarget::HasImportLibrary(this_00,config);
            if (bVar2) {
              cmStrCat<char_const(&)[16],std::__cxx11::string_const&>
                        (&prop,(char (*) [16])0x6d4ddc,suffix);
              cmInstallTargetGenerator::GetInstallFilename
                        ((string *)&objects,this_00,config,NameImplibReal);
              cmStrCat<std::__cxx11::string&,std::__cxx11::string>
                        (&importValue,&value,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &objects);
              std::__cxx11::string::~string((string *)&objects);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](properties,&prop);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)importedLocations,&prop);
              std::__cxx11::string::~string((string *)&importValue);
              std::__cxx11::string::~string((string *)&prop);
            }
          }
          cmStrCat<char_const(&)[18],std::__cxx11::string_const&>
                    (&prop,(char (*) [18])"IMPORTED_LOCATION",suffix);
          bVar2 = cmGeneratorTarget::IsAppBundleOnApple(this_00);
          if (bVar2) {
            cmInstallTargetGenerator::GetInstallFilename(&importValue,this_00,config,NameNormal);
            std::__cxx11::string::append((string *)&value);
            std::__cxx11::string::~string((string *)&importValue);
            std::__cxx11::string::append((char *)&value);
            bVar2 = cmMakefile::PlatformIsAppleEmbedded(this_00->Makefile);
            if (!bVar2) {
              std::__cxx11::string::append((char *)&value);
            }
            cmInstallTargetGenerator::GetInstallFilename(&importValue,this_00,config,NameNormal);
            std::__cxx11::string::append((string *)&value);
          }
          else {
            cmInstallTargetGenerator::GetInstallFilename(&importValue,this_00,config,NameReal);
            std::__cxx11::string::append((string *)&value);
          }
          std::__cxx11::string::~string((string *)&importValue);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&prop);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)importedLocations,&prop);
        }
      }
      std::__cxx11::string::~string((string *)&prop);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&dest);
    }
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmInstallTargetGenerator* itgen, ImportPropertyMap& properties,
  std::set<std::string>& importedLocations)
{
  // Skip rules that do not match this configuration.
  if (!(itgen && itgen->InstallsForConfig(config))) {
    return;
  }

  // Get the target to be installed.
  cmGeneratorTarget* target = itgen->GetTarget();

  // Construct the installed location of the target.
  std::string dest = itgen->GetDestination(config);
  std::string value;
  if (!cmSystemTools::FileIsFullPath(dest)) {
    // The target is installed relative to the installation prefix.
    value = "${_IMPORT_PREFIX}/";
  }
  value += dest;
  value += "/";

  if (itgen->IsImportLibrary()) {
    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_IMPLIB", suffix);

    // Append the installed file name.
    value += cmInstallTargetGenerator::GetInstallFilename(
      target, config, cmInstallTargetGenerator::NameImplibReal);

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  } else if (itgen->GetTarget()->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_OBJECTS", suffix);

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<std::string> objects;
    itgen->GetInstallObjectNames(config, objects);
    for (std::string& obj : objects) {
      obj = cmStrCat(value, obj);
    }

    // Store the property.
    properties[prop] = cmList::to_string(objects);
    importedLocations.insert(prop);
  } else {
    if (target->IsFrameworkOnApple() && target->HasImportLibrary(config)) {
      // store as well IMPLIB value
      auto importProp = cmStrCat("IMPORTED_IMPLIB", suffix);
      auto importValue =
        cmStrCat(value,
                 cmInstallTargetGenerator::GetInstallFilename(
                   target, config, cmInstallTargetGenerator::NameImplibReal));

      // Store the property.
      properties[importProp] = importValue;
      importedLocations.insert(importProp);
    }

    // Construct the property name.
    std::string prop = cmStrCat("IMPORTED_LOCATION", suffix);

    // Append the installed file name.
    if (target->IsAppBundleOnApple()) {
      value += cmInstallTargetGenerator::GetInstallFilename(target, config);
      value += ".app/";
      if (!target->Makefile->PlatformIsAppleEmbedded()) {
        value += "Contents/MacOS/";
      }
      value += cmInstallTargetGenerator::GetInstallFilename(target, config);
    } else {
      value += cmInstallTargetGenerator::GetInstallFilename(
        target, config, cmInstallTargetGenerator::NameReal);
    }

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  }
}